

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_BanDatabase.cpp
# Opt level: O2

void __thiscall
RenX::BanDatabase::add
          (BanDatabase *this,string *name,uint32_t ip,uint8_t prefix_length,uint64_t steamid,
          string *hwid,string *rdns,string *banner,string *reason,seconds length,uint16_t flags)

{
  rep rVar1;
  uint uVar2;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  _Head_base<0UL,_RenX::BanDatabase::Entry_*,_false> local_40;
  string *local_38;
  size_t __n;
  
  local_38 = name;
  std::make_unique<RenX::BanDatabase::Entry>();
  uVar2 = ((local_40._M_head_impl)->flags | flags) | 0x8000;
  __n = (size_t)uVar2;
  (local_40._M_head_impl)->flags = (uint16_t)uVar2;
  rVar1 = std::chrono::_V2::system_clock::now();
  ((local_40._M_head_impl)->timestamp).__d.__r = rVar1;
  ((local_40._M_head_impl)->length).__r = length.__r;
  (local_40._M_head_impl)->steamid = steamid;
  (local_40._M_head_impl)->ip = ip;
  (local_40._M_head_impl)->prefix_length = prefix_length;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&(local_40._M_head_impl)->hwid,hwid);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&(local_40._M_head_impl)->rdns,rdns);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&(local_40._M_head_impl)->name,local_38);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&(local_40._M_head_impl)->banner,banner);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&(local_40._M_head_impl)->reason,reason);
  std::
  vector<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>,std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>>>
  ::
  emplace_back<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>>
            ((vector<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>,std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>>>
              *)&this->m_entries,
             (unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_> *
             )&local_40);
  write(this,(int)(this->m_entries).
                  super__Vector_base<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                  super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                  .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl,
        (void *)CONCAT44(extraout_var,extraout_EDX),__n);
  std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>::
  ~unique_ptr((unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
               *)&local_40);
  return;
}

Assistant:

void RenX::BanDatabase::add(std::string name, uint32_t ip, uint8_t prefix_length, uint64_t steamid, std::string hwid, std::string rdns, std::string banner, std::string reason, std::chrono::seconds length, uint16_t flags) {
	std::unique_ptr<Entry> entry = std::make_unique<Entry>();
	entry->set_active();
	entry->flags |= flags;
	entry->timestamp = std::chrono::system_clock::now();
	entry->length = length;
	entry->steamid = steamid;
	entry->ip = ip;
	entry->prefix_length = prefix_length;
	entry->hwid = std::move(hwid);
	entry->rdns = std::move(rdns);
	entry->name = std::move(name);
	entry->banner = std::move(banner);
	entry->reason = std::move(reason);

	m_entries.push_back(std::move(entry));
	write(m_entries.back().get());
}